

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O3

void __thiscall JSON::JSON_number::JSON_number(JSON_number *this,string *value)

{
  pointer pcVar1;
  
  (this->super_JSON_value).type_code = vt_number;
  (this->super_JSON_value)._vptr_JSON_value = (_func_int **)&PTR__JSON_number_002e9eb8;
  (this->encoded)._M_dataplus._M_p = (pointer)&(this->encoded).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->encoded,pcVar1,pcVar1 + value->_M_string_length);
  return;
}

Assistant:

JSON_value(value_type_e type_code) :
            type_code(type_code)
        {
        }